

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

void Term_queue_char(term *t,wchar_t x,wchar_t y,wchar_t a,wchar_t c,wchar_t ta,wchar_t tc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int *piVar3;
  wchar_t *pwVar4;
  int *piVar5;
  wchar_t *pwVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t obg_dbl_nr;
  wchar_t ofg_dbl_nr;
  wchar_t yn;
  wchar_t yp;
  wchar_t obg_dbl;
  wchar_t ofg_dbl;
  wchar_t otc;
  wchar_t ota;
  wchar_t *scr_tcc;
  int *scr_taa;
  wchar_t oc;
  wchar_t oa;
  wchar_t *scr_cc;
  int *scr_aa;
  wchar_t ta_local;
  wchar_t c_local;
  wchar_t a_local;
  wchar_t y_local;
  wchar_t x_local;
  term *t_local;
  
  piVar3 = t->scr->a[y];
  pwVar4 = t->scr->c[y];
  wVar7 = piVar3[x];
  wVar8 = pwVar4[x];
  piVar5 = t->scr->ta[y];
  pwVar6 = t->scr->tc[y];
  wVar1 = piVar5[x];
  wVar2 = pwVar6[x];
  scr_aa._4_4_ = ta;
  if (ta == L'\0') {
    scr_aa._4_4_ = wVar1;
  }
  if (tc == L'\0') {
    tc = wVar2;
  }
  if ((((wVar7 != a) || (wVar8 != c)) || (wVar1 != scr_aa._4_4_)) || (wVar2 != tc)) {
    piVar3[x] = a;
    pwVar4[x] = c;
    piVar5[x] = scr_aa._4_4_;
    pwVar6[x] = tc;
    if (y < t->y1) {
      t->y1 = y;
    }
    if (t->y2 < y) {
      t->y2 = y;
    }
    if (x < t->x1[y]) {
      t->x1[y] = x;
    }
    if (t->x2[y] < x) {
      t->x2[y] = x;
    }
    if (t->dblh_hook != (_func_wchar_t_wchar_t_wchar_t *)0x0) {
      if ((int)(uint)tile_height <= y) {
        wVar7 = (*t->dblh_hook)(wVar7,wVar8);
        wVar8 = (*t->dblh_hook)(wVar1,wVar2);
        if ((wVar7 != L'\0') || (wVar8 != L'\0')) {
          iVar9 = y - (uint)tile_height;
          if (iVar9 < t->y1) {
            t->y1 = iVar9;
          }
          if (x < t->x1[iVar9]) {
            t->x1[iVar9] = x;
          }
          if (t->x2[iVar9] < x) {
            t->x2[iVar9] = x;
          }
        }
      }
      if (y < (int)(t->hgt - (uint)tile_height)) {
        iVar9 = y + (uint)tile_height;
        wVar7 = (*t->dblh_hook)(t->old->a[iVar9][x],t->old->c[iVar9][x]);
        wVar8 = (*t->dblh_hook)(t->old->ta[iVar9][x],t->old->tc[iVar9][x]);
        if ((wVar7 != L'\0') || (wVar8 != L'\0')) {
          if (t->y2 < iVar9) {
            t->y2 = iVar9;
          }
          if (x < t->x1[iVar9]) {
            t->x1[iVar9] = x;
          }
          if (t->x2[iVar9] < x) {
            t->x2[iVar9] = x;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Term_queue_char(term *t, int x, int y, int a, wchar_t c, int ta,
					 wchar_t tc)
{
	int *scr_aa = t->scr->a[y];
	wchar_t *scr_cc = t->scr->c[y];

	int oa = scr_aa[x];
	wchar_t oc = scr_cc[x];

	int *scr_taa = t->scr->ta[y];
	wchar_t *scr_tcc = t->scr->tc[y];

	int ota = scr_taa[x];
	wchar_t otc = scr_tcc[x];

	/* Don't change is the terrain value is 0 */
	if (!ta) ta = ota;
	if (!tc) tc = otc;

	/* Hack -- Ignore non-changes */
	if ((oa == a) && (oc == c) && (ota == ta) && (otc == tc)) return;

	/* Save the "literal" information */
	scr_aa[x] = a;
	scr_cc[x] = c;

	scr_taa[x] = ta;
	scr_tcc[x] = tc;

	/* Check for new min/max row info */
	if (y < t->y1) t->y1 = y;
	if (y > t->y2) t->y2 = y;

	/* Check for new min/max col info for this row */
	if (x < t->x1[y]) t->x1[y] = x;
	if (x > t->x2[y]) t->x2[y] = x;

	if (t->dblh_hook) {
		/*
		 * If the previous contents are a double-height tile also
		 * adjust the modified bounds to encompass the position on
		 * the previous row of tiles so it can be included when
		 * redrawing at the next refresh.
		 */
		if (y >= tile_height) {
			int ofg_dbl = (*t->dblh_hook)(oa, oc);
			int obg_dbl = (*t->dblh_hook)(ota, otc);

			if (ofg_dbl || obg_dbl) {
				int yp = y - tile_height;

				if (yp < t->y1) t->y1 = yp;
				if (x < t->x1[yp]) t->x1[yp] = x;
				if (x > t->x2[yp]) t->x2[yp] = x;
			}
		}
		/*
		 * If the next row had a double-height tile, expand the modified
		 * bounds to encompass it as well since at least its upper
		 * half will need to be redrawn for the change here.
		 */
		if (y < t->hgt - tile_height) {
			int yn = y + tile_height;
			int ofg_dbl_nr = (*t->dblh_hook)(
				t->old->a[yn][x], t->old->c[yn][x]);
			int obg_dbl_nr = (*t->dblh_hook)(
				t->old->ta[yn][x], t->old->tc[yn][x]);

			if (ofg_dbl_nr || obg_dbl_nr) {
				if (yn > t->y2) t->y2 = yn;
				if (x < t->x1[yn]) t->x1[yn] = x;
				if (x > t->x2[yn]) t->x2[yn] = x;
			}
		}
	}
}